

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_get_traffic_keys(ptls_t *tls,int is_enc,uint8_t *key,uint8_t *iv,uint64_t *seq)

{
  int iVar1;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *secret;
  
  secret = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  if (is_enc == 0) {
    secret = &tls->traffic_protection;
  }
  iVar1 = get_traffic_keys(tls->cipher_suite->aead,tls->cipher_suite->hash,key,iv,secret,
                           (ptls_iovec_t)ZEXT816(0),(char *)0x0);
  if (iVar1 == 0) {
    *seq = (secret->dec).seq;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ptls_get_traffic_keys(ptls_t *tls, int is_enc, uint8_t *key, uint8_t *iv, uint64_t *seq)
{
    struct st_ptls_traffic_protection_t *ctx = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;
    int ret;

    if ((ret = get_traffic_keys(tls->cipher_suite->aead, tls->cipher_suite->hash, key, iv, ctx->secret, ptls_iovec_init(NULL, 0),
                                NULL)) != 0)
        return ret;
    *seq = ctx->seq;
    return 0;
}